

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::StringSliceIter::finalize(StringSliceIter *this)

{
  bool bVar1;
  bool local_31;
  HeapType local_30;
  Type local_28;
  Type local_20;
  BasicType local_18 [2];
  StringSliceIter *local_10;
  StringSliceIter *this_local;
  
  local_18[1] = 1;
  local_10 = this;
  bVar1 = wasm::Type::operator==(&this->ref->type,local_18 + 1);
  local_31 = true;
  if (!bVar1) {
    local_18[0] = unreachable;
    local_31 = wasm::Type::operator==(&this->num->type,local_18);
  }
  if (local_31 == false) {
    HeapType::HeapType(&local_30,string);
    wasm::Type::Type(&local_28,local_30,NonNullable);
    (this->super_SpecificExpression<(wasm::Expression::Id)85>).super_Expression.type.id =
         local_28.id;
  }
  else {
    wasm::Type::Type(&local_20,unreachable);
    (this->super_SpecificExpression<(wasm::Expression::Id)85>).super_Expression.type.id =
         local_20.id;
  }
  return;
}

Assistant:

void StringSliceIter::finalize() {
  if (ref->type == Type::unreachable || num->type == Type::unreachable) {
    type = Type::unreachable;
  } else {
    type = Type(HeapType::string, NonNullable);
  }
}